

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall absl::lts_20250127::Cord::InlineRep::MaybeRemoveEmptyCrcNode(InlineRep *this)

{
  bool bVar1;
  Nullable<absl::cord_internal::CordRep_*> this_00;
  CordRepCrc *pCVar2;
  Nullable<absl::cord_internal::CordzInfo_*> this_01;
  CordRep *rep;
  InlineRep *this_local;
  
  this_00 = tree(this);
  if ((this_00 != (Nullable<absl::cord_internal::CordRep_*>)0x0) && (this_00->length == 0)) {
    bVar1 = cord_internal::CordRep::IsCrc(this_00);
    if (!bVar1) {
      __assert_fail("rep->IsCrc()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                    ,0x527,"void absl::Cord::InlineRep::MaybeRemoveEmptyCrcNode()");
    }
    pCVar2 = cord_internal::CordRep::crc(this_00);
    if (pCVar2->child != (CordRep *)0x0) {
      __assert_fail("rep->crc()->child == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                    ,0x528,"void absl::Cord::InlineRep::MaybeRemoveEmptyCrcNode()");
    }
    this_01 = cordz_info(this);
    if (this_01 != (Nullable<absl::cord_internal::CordzInfo_*>)0x0) {
      cord_internal::CordzInfo::Untrack(this_01);
    }
    cord_internal::CordRep::Unref(this_00);
    ResetToEmpty(this);
  }
  return;
}

Assistant:

inline void Cord::InlineRep::MaybeRemoveEmptyCrcNode() {
  CordRep* rep = tree();
  if (rep == nullptr || ABSL_PREDICT_TRUE(rep->length > 0)) {
    return;
  }
  assert(rep->IsCrc());
  assert(rep->crc()->child == nullptr);
  CordzInfo::MaybeUntrackCord(cordz_info());
  CordRep::Unref(rep);
  ResetToEmpty();
}